

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O0

ze_result_t
loader::zeDriverGetProperties(ze_driver_handle_t hDriver,ze_driver_properties_t *pDriverProperties)

{
  ze_pfnDriverGetProperties_t pfnGetProperties;
  dditable_t *dditable;
  ze_result_t result;
  ze_driver_properties_t *pDriverProperties_local;
  ze_driver_handle_t hDriver_local;
  
  if (*(code **)(*(long *)(hDriver + 8) + 0xa8) == (code *)0x0) {
    hDriver_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    hDriver_local._4_4_ =
         (**(code **)(*(long *)(hDriver + 8) + 0xa8))(*(undefined8 *)hDriver,pDriverProperties);
  }
  return hDriver_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeDriverGetProperties(
        ze_driver_handle_t hDriver,                     ///< [in] handle of the driver instance
        ze_driver_properties_t* pDriverProperties       ///< [in,out] query result for driver properties
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_driver_object_t*>( hDriver )->dditable;
        auto pfnGetProperties = dditable->ze.Driver.pfnGetProperties;
        if( nullptr == pfnGetProperties )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hDriver = reinterpret_cast<ze_driver_object_t*>( hDriver )->handle;

        // forward to device-driver
        result = pfnGetProperties( hDriver, pDriverProperties );

        return result;
    }